

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::ColSizeWriter>
          (NLFeeder_Easy *this,ColSizeWriter *csw)

{
  int iVar1;
  NLFeeder_Easy *this_00;
  NLFeeder<mp::NLFeeder_Easy,_void_*> *in_RDI;
  int i;
  int in_stack_ffffffffffffffcc;
  int local_14;
  
  iVar1 = NLFeeder<mp::NLFeeder_Easy,_void_*>::WantColumnSizes(in_RDI);
  if (iVar1 != 0) {
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x1b8) + -1; local_14 = local_14 + 1) {
      this_00 = (NLFeeder_Easy *)(in_RDI + 0x1a0);
      iVar1 = VPermInv(this_00,in_stack_ffffffffffffffcc);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)this_00,(long)iVar1);
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::ColSizeWriter::Write
                ((ColSizeWriter *)this_00,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void FeedColumnSizes(ColSizeWriter& csw) {
    if (WantColumnSizes())
      for (int i=0; i < header_.num_vars-1; ++i)
        csw.Write(col_sizes_[VPermInv(i)]);
  }